

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool tinyexr::miniz::mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int *piVar5;
  uint *puVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  mz_bool mVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  mz_zip_internal_state *pmVar15;
  mz_zip_internal_state *pmVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  int *piVar21;
  int iVar22;
  mz_uint32 t;
  int iVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  mz_uint64 mVar27;
  ulong uVar28;
  bool bVar29;
  mz_uint32 buf_u32 [1024];
  
  uVar20 = pZip->m_archive_size;
  if (uVar20 < 0x16) {
    return 0;
  }
  mVar27 = uVar20 - 0x1000;
  if ((long)uVar20 < 0x1001) {
    mVar27 = 0;
  }
LAB_0011d156:
  sVar26 = uVar20 - mVar27;
  if (0xfff < sVar26) {
    sVar26 = 0x1000;
  }
  sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar27,buf_u32,sVar26);
  if (sVar14 != sVar26) {
    return 0;
  }
  uVar25 = (int)sVar26 - 4;
  do {
    if ((int)uVar25 < 0) goto LAB_0011d191;
    uVar20 = (ulong)uVar25;
    uVar25 = uVar25 - 1;
  } while (*(int *)((long)buf_u32 + uVar20) != 0x6054b50);
  sVar26 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar27 + uVar20,buf_u32,0x16);
  if (sVar26 != 0x16) {
    return 0;
  }
  if (buf_u32[0] != 0x6054b50) {
    return 0;
  }
  uVar25 = (uint)buf_u32[2]._2_2_;
  pZip->m_total_files = (uint)buf_u32[2]._2_2_;
  if ((uint)buf_u32[2]._2_2_ != (uint)(ushort)buf_u32[2]) {
    return 0;
  }
  if (buf_u32[1]._2_2_ != 0 || (short)buf_u32[1] != 0) {
    if ((short)buf_u32[1] != 1) {
      return 0;
    }
    if (buf_u32[1]._2_2_ != 1) {
      return 0;
    }
  }
  if (buf_u32[3] < (uint)buf_u32[2]._2_2_ * 0x2e) {
    return 0;
  }
  uVar20 = (ulong)buf_u32[4];
  uVar19 = (ulong)buf_u32[3];
  if (pZip->m_archive_size < uVar20 + uVar19) {
    return 0;
  }
  pZip->m_central_directory_file_ofs = uVar20;
  if (buf_u32[2]._2_2_ == 0) {
    uVar20 = 0;
  }
  else {
    pmVar16 = pZip->m_pState;
    pmVar15 = pmVar16;
    if ((pmVar16->m_central_dir).m_capacity < uVar19) {
      mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar16->m_central_dir,uVar19,0);
      if (mVar10 == 0) {
        return 0;
      }
      pmVar15 = pZip->m_pState;
      uVar25 = pZip->m_total_files;
    }
    (pmVar16->m_central_dir).m_size = uVar19;
    uVar17 = (ulong)uVar25;
    pmVar16 = pmVar15;
    if ((pmVar15->m_central_dir_offsets).m_capacity < uVar17) {
      mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar15->m_central_dir_offsets,uVar17,0);
      if (mVar10 == 0) {
        return 0;
      }
      pmVar16 = pZip->m_pState;
    }
    (pmVar15->m_central_dir_offsets).m_size = uVar17;
    pmVar15 = pmVar16;
    if ((flags >> 0xb & 1) == 0) {
      uVar17 = (ulong)pZip->m_total_files;
      if ((pmVar16->m_sorted_central_dir_offsets).m_capacity < uVar17) {
        mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar16->m_sorted_central_dir_offsets,uVar17,0);
        if (mVar10 == 0) {
          return 0;
        }
        pmVar15 = pZip->m_pState;
      }
      (pmVar16->m_sorted_central_dir_offsets).m_size = uVar17;
    }
    sVar26 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar20,(pmVar15->m_central_dir).m_p,uVar19);
    if (sVar26 != uVar19) {
      return 0;
    }
    pmVar16 = pZip->m_pState;
    piVar5 = (int *)(pmVar16->m_central_dir).m_p;
    piVar21 = piVar5;
    for (uVar19 = 0; uVar20 = (ulong)pZip->m_total_files, uVar19 < uVar20; uVar19 = uVar19 + 1) {
      if (buf_u32[3] < 0x2e) {
        return 0;
      }
      if (*piVar21 != 0x2014b50) {
        return 0;
      }
      *(int *)((long)(pmVar16->m_central_dir_offsets).m_p + uVar19 * 4) = (int)piVar21 - (int)piVar5
      ;
      if ((flags >> 0xb & 1) == 0) {
        *(int *)((long)(pmVar16->m_sorted_central_dir_offsets).m_p + uVar19 * 4) = (int)uVar19;
      }
      uVar25 = piVar21[5];
      uVar24 = piVar21[6];
      if ((*(int *)((long)piVar21 + 10) == 0) && (uVar24 != uVar25)) {
        return 0;
      }
      if (uVar24 == 0xffffffff) {
        return 0;
      }
      if (uVar24 != 0 && uVar25 == 0) {
        return 0;
      }
      if (uVar25 == 0xffffffff) {
        return 0;
      }
      if (*(short *)((long)piVar21 + 0x22) != (short)buf_u32[1] &&
          *(short *)((long)piVar21 + 0x22) != 1) {
        return 0;
      }
      if (pZip->m_archive_size < (ulong)uVar25 + (ulong)*(uint *)((long)piVar21 + 0x2a) + 0x1e) {
        return 0;
      }
      uVar25 = (uint)*(ushort *)(piVar21 + 8) +
               (uint)*(ushort *)((long)piVar21 + 0x1e) + (uint)*(ushort *)(piVar21 + 7) + 0x2e;
      bVar29 = buf_u32[3] < uVar25;
      buf_u32[3] = buf_u32[3] - uVar25;
      if (bVar29) {
        return 0;
      }
      piVar21 = (int *)((long)piVar21 + (ulong)uVar25);
    }
  }
  if ((flags >> 0xb & 1) == 0) {
    pmVar16 = pZip->m_pState;
    puVar6 = (uint *)(pmVar16->m_sorted_central_dir_offsets).m_p;
    iVar22 = (int)uVar20;
    for (iVar11 = iVar22 + -2 >> 1; iVar13 = iVar11, -1 < iVar11; iVar11 = iVar11 + -1) {
      while (iVar23 = iVar13 * 2 + 1, iVar23 < iVar22) {
        iVar12 = iVar13 * 2 + 2;
        uVar25 = 0;
        pvVar7 = (pmVar16->m_central_dir).m_p;
        pvVar8 = (pmVar16->m_central_dir_offsets).m_p;
        if (iVar12 < iVar22) {
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar23] * 4);
          uVar19 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar12] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar19 + 0x1c);
          uVar25 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar25 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar28 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar28 + uVar17 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar25 + uVar17 + 0x2e); uVar28 = uVar28 + 1) {
            bVar18 = *pbVar1;
            bVar9 = bVar18 + 0x20;
            if (0x19 < (byte)(bVar18 + 0xbf)) {
              bVar9 = bVar18;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar28 + uVar19 + 0x2e);
            bVar18 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar18 = bVar2;
            }
            if (bVar9 != bVar18) break;
            bVar18 = bVar9;
          }
          bVar29 = bVar9 < bVar18;
          if (uVar25 == uVar28) {
            bVar29 = uVar3 < uVar4;
          }
          uVar25 = (uint)bVar29;
        }
        iVar23 = uVar25 + iVar23;
        uVar25 = puVar6[iVar13];
        uVar19 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar25 * 4);
        uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar23] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar19 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
        uVar24 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar24 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar28 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar28 + uVar19 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar24 + uVar19 + 0x2e); uVar28 = uVar28 + 1) {
          bVar9 = *pbVar1;
          bVar18 = bVar9 + 0x20;
          if (0x19 < (byte)(bVar9 + 0xbf)) {
            bVar18 = bVar9;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar28 + uVar17 + 0x2e);
          bVar9 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar9 = bVar2;
          }
          if (bVar18 != bVar9) break;
        }
        bVar29 = bVar9 <= bVar18;
        if (uVar24 == uVar28) {
          bVar29 = uVar4 <= uVar3;
        }
        if (bVar29) break;
        puVar6[iVar13] = puVar6[iVar23];
        puVar6[iVar23] = uVar25;
        iVar13 = iVar23;
      }
    }
LAB_0011d602:
    if (1 < (int)uVar20) {
      uVar20 = uVar20 - 1;
      uVar25 = puVar6[uVar20 & 0xffffffff];
      puVar6[uVar20 & 0xffffffff] = *puVar6;
      *puVar6 = uVar25;
      iVar22 = 0;
      while( true ) {
        iVar11 = iVar22 * 2 + 1;
        if ((int)uVar20 <= iVar11) break;
        iVar13 = iVar22 * 2 + 2;
        uVar24 = 0;
        pvVar7 = (pmVar16->m_central_dir).m_p;
        pvVar8 = (pmVar16->m_central_dir_offsets).m_p;
        if (iVar13 < (int)uVar20) {
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar11] * 4);
          uVar19 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar13] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar19 + 0x1c);
          uVar24 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar24 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar28 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar28 + uVar17 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar24 + uVar17 + 0x2e); uVar28 = uVar28 + 1) {
            bVar9 = *pbVar1;
            bVar18 = bVar9 + 0x20;
            if (0x19 < (byte)(bVar9 + 0xbf)) {
              bVar18 = bVar9;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar28 + uVar19 + 0x2e);
            bVar9 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar9 = bVar2;
            }
            if (bVar18 != bVar9) break;
          }
          bVar29 = bVar18 < bVar9;
          if (uVar24 == uVar28) {
            bVar29 = uVar3 < uVar4;
          }
          uVar24 = (uint)bVar29;
        }
        iVar11 = uVar24 + iVar11;
        uVar19 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar25 * 4);
        uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar11] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar19 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
        uVar24 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar24 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar28 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar28 + uVar19 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar24 + uVar19 + 0x2e); uVar28 = uVar28 + 1) {
          bVar18 = *pbVar1;
          bVar9 = bVar18 + 0x20;
          if (0x19 < (byte)(bVar18 + 0xbf)) {
            bVar9 = bVar18;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar28 + uVar17 + 0x2e);
          bVar18 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar18 = bVar2;
          }
          if (bVar9 != bVar18) break;
          bVar18 = bVar9;
        }
        bVar29 = bVar18 <= bVar9;
        if (uVar24 == uVar28) {
          bVar29 = uVar4 <= uVar3;
        }
        if (bVar29) break;
        puVar6[iVar22] = puVar6[iVar11];
        puVar6[iVar11] = uVar25;
        iVar22 = iVar11;
      }
      goto LAB_0011d602;
    }
  }
  return 1;
LAB_0011d191:
  if (mVar27 == 0) {
    return 0;
  }
  uVar20 = pZip->m_archive_size;
  uVar19 = uVar20 - mVar27;
  mVar27 = mVar27 - 0xffd;
  if (0x10014 < uVar19) {
    return 0;
  }
  goto LAB_0011d156;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint32 flags) {
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first
  // 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end
  // towards the beginning.
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) break;
    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files =
            MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) !=
       MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) <
      pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size) return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another
    // heap block to hold the unsorted central dir file record offsets, and
    // another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some
    // basic sanity checking on each record, and check for zip64 entries (which
    // are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
           (decomp_size != comp_size)) ||
          (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) ||
          (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1)) return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
           MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return MZ_FALSE;
      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}